

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_aggregate_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::BaseSelectBinder::BindAggregate
          (BindResult *__return_storage_ptr__,BaseSelectBinder *this,FunctionExpression *aggr,
          AggregateFunctionCatalogEntry *func,idx_t depth)

{
  string *psVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> *this_01;
  char cVar2;
  undefined1 uVar3;
  pointer pVVar4;
  pointer pOVar5;
  Binder *pBVar6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  pointer pBVar8;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var9;
  BoundSelectNode *pBVar10;
  pointer puVar11;
  pointer puVar12;
  size_type sVar13;
  pointer pcVar14;
  BoundResultModifier *pBVar15;
  optional_ptr<duckdb::Binder,_true> oVar16;
  FunctionExpression *pFVar17;
  bool bVar18;
  OrderType order_type;
  OrderByNullType OVar19;
  int iVar20;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar21;
  pointer pOVar22;
  reference pvVar23;
  reference pvVar24;
  type pPVar25;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar26;
  pointer pEVar27;
  type pEVar28;
  vector<duckdb::Value,_true> *pvVar29;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var30;
  pointer puVar31;
  pointer pPVar32;
  BaseExpression *this_02;
  ConstantExpression *pCVar33;
  ClientConfig *pCVar34;
  idx_t offset;
  ClientContext *pCVar35;
  DBConfig *pDVar36;
  CollationBinding *this_03;
  pointer pBVar37;
  pointer pBVar38;
  iterator iVar39;
  mapped_type *pmVar40;
  reference pvVar41;
  BinderException *pBVar42;
  pointer puVar43;
  long lVar44;
  AggregateFunctionSet *this_04;
  pointer pOVar45;
  size_type __n;
  byte bVar46;
  undefined8 *puVar47;
  undefined8 *puVar48;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var49;
  pointer pOVar50;
  OrderByNode *order;
  size_type sVar51;
  BoundOrderByNode *order_by;
  pointer v;
  pointer pBVar52;
  byte bVar53;
  Value value;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  vector<duckdb::LogicalType,_true> arguments;
  ErrorData error;
  optional_idx best_function;
  vector<duckdb::LogicalType,_true> types;
  AggregateFunction bound_function;
  OrderByNullType null_order;
  FunctionBinder function_binder;
  AggregateBinder aggregate_binder;
  type local_6f8;
  FunctionBinder local_6e8;
  undefined4 local_6d4;
  FunctionExpression *local_6d0;
  ulong local_6c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_6c0;
  undefined1 local_6b8 [64];
  BindResult *local_678;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_670;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_668;
  _Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_> local_660
  ;
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> local_658;
  type local_650;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_648;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_628;
  idx_t local_610;
  undefined1 local_608 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0;
  _Alloc_hider local_5e0;
  aggregate_deserialize_t local_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  undefined1 local_5c0 [40];
  aggregate_finalize_t p_Stack_598;
  AggregateFunctionCatalogEntry *local_588;
  optional_idx local_580;
  Value local_578;
  undefined1 local_530 [8];
  undefined1 local_528 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_510;
  _Alloc_hider local_500;
  element_type local_4f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_4e0 [64];
  LogicalType LStack_4a0;
  FunctionStability local_488;
  FunctionNullHandling FStack_487;
  FunctionErrors FStack_486;
  FunctionCollationHandling FStack_485;
  undefined8 auStack_480 [14];
  element_type *local_410;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  ColumnBinding local_400;
  undefined1 local_3f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  char local_3c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  char local_3a8 [16];
  undefined1 local_398 [16];
  _Alloc_hider local_388;
  pointer local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  undefined1 local_360 [8];
  _Alloc_hider local_358;
  char local_348 [16];
  _Alloc_hider local_338;
  char local_328 [16];
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  optional_idx local_2e8;
  undefined1 local_2e0 [104];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_278;
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  undefined1 local_248 [16];
  _Alloc_hider local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_228;
  undefined1 local_218 [16];
  __node_base local_208;
  pointer local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  optional_idx local_1e8;
  undefined1 local_1e0 [72];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_198 [56];
  BaseScalarFunction local_160;
  undefined8 auStack_b0 [14];
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar53 = 0;
  this->bound_aggregate = true;
  local_678 = __return_storage_ptr__;
  local_610 = depth;
  local_588 = func;
  AggregateBinder::AggregateBinder
            ((AggregateBinder *)local_2e0,(this->super_ExpressionBinder).binder,
             (this->super_ExpressionBinder).context);
  ErrorData::ErrorData((ErrorData *)local_608);
  expr = &aggr->filter;
  uVar21 = extraout_RAX;
  if ((aggr->filter).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ExpressionBinder::BindChild((ExpressionBinder *)local_2e0,expr,0,(ErrorData *)local_608);
    uVar21 = extraout_RAX_00;
  }
  this_01 = &aggr->order_bys;
  local_6d4 = (undefined4)CONCAT71((int7)((ulong)uVar21 >> 8),1);
  if (((aggr->order_bys).
       super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
       super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
       super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl == (OrderModifier *)0x0)
     || (pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                   ::operator->(this_01),
        (long)(pOVar22->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pOVar22->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10)) {
LAB_00d7094e:
    bVar18 = false;
    local_6c8 = 0;
  }
  else {
    psVar1 = &aggr->function_name;
    iVar20 = ::std::__cxx11::string::compare((char *)psVar1);
    if (iVar20 == 0) {
      local_6c8 = 1;
      bVar18 = false;
    }
    else {
      iVar20 = ::std::__cxx11::string::compare((char *)psVar1);
      if ((iVar20 != 0) && (iVar20 = ::std::__cxx11::string::compare((char *)psVar1), iVar20 != 0))
      goto LAB_00d7094e;
      pDVar36 = DBConfig::GetConfig((this->super_ExpressionBinder).context);
      pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      pvVar23 = vector<duckdb::OrderByNode,_true>::operator[](&pOVar22->orders,0);
      cVar2 = pvVar23->type;
      if (cVar2 == '\x01') {
        uVar3 = (pDVar36->options).default_order_type;
        cVar2 = uVar3;
      }
      bVar18 = cVar2 == '\x03';
      local_6c8 = 2;
    }
    local_6d4 = 0;
  }
  local_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&aggr->children;
  local_6d0 = aggr;
  if ((aggr->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (aggr->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar51 = 0;
    do {
      pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)local_670._M_pi,sVar51);
      ExpressionBinder::BindChild((ExpressionBinder *)local_2e0,pvVar24,0,(ErrorData *)local_608);
      puVar43 = (aggr->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar31 = (aggr->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((local_608[0] == false && (char)local_6d4 == '\0') &&
         (sVar51 == ((long)puVar31 - (long)puVar43 >> 3) - 1U)) {
        pCVar35 = (this->super_ExpressionBinder).context;
        pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar24);
        puVar26 = BoundExpression::GetExpression(pPVar25);
        pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar26);
        iVar20 = (*(pEVar27->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar27);
        if ((char)iVar20 != '\0') {
          pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(puVar26);
          ExpressionExecutor::EvaluateScalar((Value *)local_6b8,pCVar35,pEVar28,false);
          if (local_6b8[0] == (ExportAggregateFunction)0x65) {
            local_628.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_628.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_628.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar29 = ListValue::GetChildren((Value *)local_6b8);
            pVVar4 = (pvVar29->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (v = (pvVar29->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start; v != pVVar4; v = v + 1) {
              NegatePercentileValue((Value *)local_530,v,bVar18);
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
              emplace_back<duckdb::Value>
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_628,
                         (Value *)local_530);
              Value::~Value((Value *)local_530);
            }
            if (local_628.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_628.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
              local_530 = (undefined1  [8])((long)local_528 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_530,"Empty list in percentile not allowed","");
              BinderException::BinderException(pBVar42,(string *)local_530);
              __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_648,
                       &local_628);
            aggr = local_6d0;
            Value::LIST(&local_578,(vector<duckdb::Value,_true> *)&local_648);
            _Var30._M_head_impl = (Expression *)operator_new(0x98);
            Value::Value((Value *)local_530,&local_578);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)_Var30._M_head_impl,(Value *)local_530);
            Value::~Value((Value *)local_530);
            _Var49._M_head_impl =
                 (puVar26->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (puVar26->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var30._M_head_impl;
            if (_Var49._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var49._M_head_impl)->super_BaseExpression + 8))();
            }
            Value::~Value(&local_578);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_648);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_628);
          }
          else {
            NegatePercentileValue(&local_578,(Value *)local_6b8,bVar18);
            _Var30._M_head_impl = (Expression *)operator_new(0x98);
            Value::Value((Value *)local_530,&local_578);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)_Var30._M_head_impl,(Value *)local_530);
            Value::~Value((Value *)local_530);
            _Var49._M_head_impl =
                 (puVar26->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (puVar26->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var30._M_head_impl;
            if (_Var49._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var49._M_head_impl)->super_BaseExpression + 8))();
            }
            Value::~Value(&local_578);
          }
          Value::~Value((Value *)local_6b8);
        }
        puVar43 = (aggr->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar31 = (aggr->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      sVar51 = sVar51 + 1;
    } while (sVar51 < (ulong)((long)puVar31 - (long)puVar43 >> 3));
  }
  if (((this_01->
       super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)._M_t.
       super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
       super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl != (OrderModifier *)0x0)
     && (pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                   ::operator->(this_01),
        (pOVar22->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pOVar22->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
    pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->(this_01);
    pOVar45 = (pOVar22->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start;
    pOVar5 = (pOVar22->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pOVar45 != pOVar5) {
      do {
        this_00 = &pOVar45->expression;
        pPVar32 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_00);
        if ((pPVar32->super_BaseExpression).type == VALUE_CONSTANT) {
          this_02 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(this_00)->super_BaseExpression;
          pCVar33 = BaseExpression::Cast<duckdb::ConstantExpression>(this_02);
          bVar18 = LogicalType::IsIntegral(&(pCVar33->value).type_);
          if ((!bVar18) &&
             (pCVar34 = ClientConfig::GetConfig((this->super_ExpressionBinder).context),
             pCVar34->order_by_non_integer_literal == false)) {
            pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
            pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(this_00);
            local_530 = (undefined1  [8])((long)local_528 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_530,
                       "ORDER BY non-integer literal has no effect.\n* SET order_by_non_integer_literal=true to allow this behavior.\n\nPerhaps you misplaced ORDER BY; ORDER BY must appear after all regular arguments of the aggregate."
                       ,"");
            BinderException::BinderException<>(pBVar42,pPVar25,(string *)local_530);
            __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        ExpressionBinder::BindChild((ExpressionBinder *)local_2e0,this_00,0,(ErrorData *)local_608);
        pOVar45 = pOVar45 + 1;
      } while (pOVar45 != pOVar5);
    }
  }
  pFVar17 = local_6d0;
  if (local_608[0] == true) {
    if (local_2e0._80_8_ == local_2e0._88_8_) {
      local_1e0._0_2_ = local_608._0_2_;
      if ((undefined1 *)local_608._8_8_ == local_608 + 0x18) {
        local_1e0._32_4_ = local_5f0._8_4_;
        local_1e0._36_4_ = local_5f0._12_4_;
        local_1e0._8_8_ = (Expression *)(local_1e0 + 0x18);
      }
      else {
        local_1e0._8_8_ = local_608._8_8_;
      }
      local_1e0._16_8_ = local_608._16_8_;
      local_608._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5f0._M_allocated_capacity._0_4_ = local_5f0._M_allocated_capacity._0_4_ & 0xffffff00;
      if (local_5e0._M_p == local_608 + 0x38) {
        local_1e0._64_4_ = local_5d0._8_4_;
        local_1e0._68_4_ = local_5d0._12_4_;
        local_1e0._40_8_ = local_1e0 + 0x38;
      }
      else {
        local_1e0._40_8_ = local_5e0._M_p;
      }
      local_1e0._48_8_ = local_5d8;
      local_5d8 = (aggregate_deserialize_t)0x0;
      local_5d0._M_allocated_capacity._0_4_ = local_5d0._M_allocated_capacity._0_4_ & 0xffffff00;
      local_608._8_8_ = local_608 + 0x18;
      local_5e0._M_p = local_608 + 0x38;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(local_198,local_5c0);
      BindResult::BindResult(local_678,(ErrorData *)local_1e0);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_198);
      if ((undefined1 *)local_1e0._40_8_ != local_1e0 + 0x38) {
        operator_delete((void *)local_1e0._40_8_);
      }
      _Var49._M_head_impl = (Expression *)local_1e0._8_8_;
      if ((Expression *)local_1e0._8_8_ == (Expression *)(local_1e0 + 0x18)) goto LAB_00d71dc1;
LAB_00d71dbc:
      operator_delete(_Var49._M_head_impl);
      goto LAB_00d71dc1;
    }
    if ((local_6d0->children).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_6d0->children).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar51 = 0;
      do {
        pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)local_670._M_pi,sVar51);
        local_360._0_2_ = local_608._0_2_;
        local_358._M_p = local_348;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,local_608._8_8_,
                   (code *)((long)(_func_int ***)local_608._16_8_ + local_608._8_8_));
        local_338._M_p = local_328;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,local_5e0._M_p,local_5d8 + (long)local_5e0._M_p);
        local_318._0_8_ = (__buckets_ptr)0x0;
        local_318._8_8_ = local_5c0._8_8_;
        local_308._M_allocated_capacity = 0;
        local_308._8_8_ = local_5c0._24_8_;
        local_2f8._M_allocated_capacity = local_5c0._32_8_;
        local_2f8._8_8_ = p_Stack_598;
        local_2e8.index = 0;
        local_6b8._0_8_ = (type)local_318;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_318,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_5c0,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                    *)local_6b8);
        ExpressionBinder::BindCorrelatedColumns
                  ((BindResult *)local_530,(ExpressionBinder *)local_2e0,pvVar24,
                   (ErrorData *)local_360);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_318);
        if (local_338._M_p != local_328) {
          operator_delete(local_338._M_p);
        }
        if (local_358._M_p != local_348) {
          operator_delete(local_358._M_p);
        }
        if (local_528[0] == true) {
          local_6b8._0_8_ = local_6b8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6b8,anon_var_dwarf_4ed193b + 9);
          ErrorData::Throw((ErrorData *)local_528,(string *)local_6b8);
        }
        pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)local_670._M_pi,sVar51);
        pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar24);
        puVar26 = BoundExpression::GetExpression(pPVar25);
        pBVar6 = (this->super_ExpressionBinder).binder;
        pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(puVar26);
        ExpressionBinder::ExtractCorrelatedExpressions(pBVar6,pEVar28);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_4e0);
        if ((element_type *)local_500._M_p != &local_4f0) {
          operator_delete(local_500._M_p);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_ != &local_510) {
          operator_delete((void *)local_528._8_8_);
        }
        if (local_530 != (undefined1  [8])0x0) {
          (*((BaseExpression *)local_530)->_vptr_BaseExpression[1])();
        }
        sVar51 = sVar51 + 1;
      } while (sVar51 < (ulong)((long)(pFVar17->children).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pFVar17->children).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((expr->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      local_260._0_2_ = local_608._0_2_;
      local_258._M_p = (pointer)local_248;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_608._8_8_,
                 (code *)((long)(_func_int ***)local_608._16_8_ + local_608._8_8_));
      local_238._M_p = (pointer)&local_228;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_5e0._M_p,local_5d8 + (long)local_5e0._M_p);
      local_218._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218._8_8_ = local_5c0._8_8_;
      local_208._M_nxt = (_Hash_node_base *)0x0;
      local_200 = (pointer)local_5c0._24_8_;
      local_1f8._M_allocated_capacity = local_5c0._32_8_;
      local_1f8._8_8_ = p_Stack_598;
      local_1e8.index = 0;
      local_6b8._0_8_ = (type)local_218;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_218,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_5c0,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                  *)local_6b8);
      ExpressionBinder::BindCorrelatedColumns
                ((BindResult *)local_530,(ExpressionBinder *)local_2e0,expr,(ErrorData *)local_260);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_218);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_p != &local_228) {
        operator_delete(local_238._M_p);
      }
      if ((pointer)local_258._M_p != (pointer)local_248) {
        operator_delete(local_258._M_p);
      }
      if (local_528[0] == true) {
        local_6b8._0_8_ = local_6b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6b8,anon_var_dwarf_4ed193b + 9);
        ErrorData::Throw((ErrorData *)local_528,(string *)local_6b8);
      }
      pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(expr);
      puVar26 = BoundExpression::GetExpression(pPVar25);
      pBVar6 = (this->super_ExpressionBinder).binder;
      pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar26);
      ExpressionBinder::ExtractCorrelatedExpressions(pBVar6,pEVar28);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_4e0);
      if ((element_type *)local_500._M_p != &local_4f0) {
        operator_delete(local_500._M_p);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_ != &local_510) {
        operator_delete((void *)local_528._8_8_);
      }
      if (local_530 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_530)->_vptr_BaseExpression[1])();
      }
    }
    if (((this_01->
         super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)._M_t.
         super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
         .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl != (OrderModifier *)0x0
        ) && (pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                        ::operator->(this_01),
             (pOVar22->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pOVar22->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish)) {
      pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      pOVar45 = (pOVar22->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar5 = (pOVar22->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pOVar45 != pOVar5) {
        do {
          local_3f0._16_2_ = local_608._0_2_;
          local_3d8._M_allocated_capacity = (size_type)local_3c8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3d8,local_608._8_8_,
                     (code *)((long)(_func_int ***)local_608._16_8_ + local_608._8_8_));
          local_3b8._M_allocated_capacity = (size_type)local_3a8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_5e0._M_p,local_5d8 + (long)local_5e0._M_p);
          local_398._0_8_ = (pointer)0x0;
          local_398._8_8_ = local_5c0._8_8_;
          local_388._M_p = (pointer)0x0;
          local_380 = (pointer)local_5c0._24_8_;
          local_378._M_allocated_capacity = local_5c0._32_8_;
          local_378._8_8_ = p_Stack_598;
          local_368._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_6b8._0_8_ = (type)local_398;
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_398,
                     (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_5c0,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                      *)local_6b8);
          ExpressionBinder::BindCorrelatedColumns
                    ((BindResult *)local_530,(ExpressionBinder *)local_2e0,&pOVar45->expression,
                     (ErrorData *)(local_3f0 + 0x10));
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_398);
          if ((char *)local_3b8._M_allocated_capacity != local_3a8) {
            operator_delete((void *)local_3b8._M_allocated_capacity);
          }
          if ((char *)local_3d8._M_allocated_capacity != local_3c8) {
            operator_delete((void *)local_3d8._M_allocated_capacity);
          }
          if (local_528[0] == true) {
            local_6b8._0_8_ = local_6b8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_6b8,anon_var_dwarf_4ed193b + 9);
            ErrorData::Throw((ErrorData *)local_528,(string *)local_6b8);
          }
          pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(&pOVar45->expression);
          puVar26 = BoundExpression::GetExpression(pPVar25);
          pBVar6 = (this->super_ExpressionBinder).binder;
          pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(puVar26);
          ExpressionBinder::ExtractCorrelatedExpressions(pBVar6,pEVar28);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(local_4e0);
          if ((element_type *)local_500._M_p != &local_4f0) {
            operator_delete(local_500._M_p);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_ != &local_510) {
            operator_delete((void *)local_528._8_8_);
          }
          if (local_530 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_530)->_vptr_BaseExpression[1])();
          }
          pOVar45 = pOVar45 + 1;
        } while (pOVar45 != pOVar5);
      }
    }
  }
  else if ((local_610 != 0) && (local_2e0._80_8_ == local_2e0._88_8_)) {
    local_530 = (undefined1  [8])((long)local_528 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_530,
               "Aggregate with only constant parameters has to be bound in the root subquery","");
    BindResult::BindResult(local_678,(string *)local_530);
    _Var49._M_head_impl = (Expression *)local_530;
    if (local_530 == (undefined1  [8])((long)local_528 + 8)) goto LAB_00d71dc1;
    goto LAB_00d71dbc;
  }
  if ((expr->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    local_6f8 = (type)0x0;
  }
  else {
    pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    puVar26 = BoundExpression::GetExpression(pPVar25);
    pCVar35 = (this->super_ExpressionBinder).context;
    local_6c0._M_head_impl =
         (puVar26->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar26->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    LogicalType::LogicalType((LogicalType *)local_530,BOOLEAN);
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)local_6b8,pCVar35,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_6c0,(LogicalType *)local_530,false);
    local_6f8 = (type)local_6b8._0_8_;
    local_6b8._0_8_ = (type)0x0;
    LogicalType::~LogicalType((LogicalType *)local_530);
    if (local_6c0._M_head_impl != (Expression *)0x0) {
      (*((local_6c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_6c0._M_head_impl = (Expression *)0x0;
  }
  pFVar17 = local_6d0;
  local_578.type_.id_ = INVALID;
  local_578.type_.physical_type_ = ~INVALID;
  local_578.type_._2_6_ = 0;
  local_578.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_578.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_628.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_628.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_628.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_648.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_648.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_648.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((char)local_6d4 == '\0') {
    iVar20 = ::std::__cxx11::string::compare((char *)&local_6d0->function_name);
    if ((ulong)((long)(pFVar17->children).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pFVar17->children).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < local_6c8) {
      pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      pOVar45 = (pOVar22->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar5 = (pOVar22->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pOVar45 != pOVar5) {
        do {
          pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(&pOVar45->expression);
          puVar26 = BoundExpression::GetExpression(pPVar25);
          pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar26);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_578
                     ,&pEVar27->return_type);
          pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar26);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_628
                     ,&pEVar27->return_type);
          if (iVar20 == 0) {
            pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(puVar26);
            (*(pEVar27->super_BaseExpression)._vptr_BaseExpression[0x11])
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_530,pEVar27);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_648,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_530);
            if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                local_530 != (Expression *)0x0) {
              (**(code **)(*(undefined **)local_530 + 8))();
            }
          }
          else {
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_648,puVar26);
          }
          pOVar45 = pOVar45 + 1;
        } while (pOVar45 != pOVar5);
      }
    }
    if (iVar20 != 0) {
      pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      pOVar45 = (pOVar22->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar5 = (pOVar22->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pOVar50 = pOVar45;
      if (pOVar5 != pOVar45) {
        do {
          _Var7._M_head_impl =
               (pOVar50->expression).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
          }
          (pOVar50->expression).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          pOVar50 = pOVar50 + 1;
        } while (pOVar50 != pOVar5);
        (pOVar22->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_finish = pOVar45;
      }
    }
  }
  pFVar17 = local_6d0;
  if ((local_6d0->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_6d0->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar51 = 0;
    do {
      pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)local_670._M_pi,sVar51);
      pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(pvVar24);
      puVar26 = BoundExpression::GetExpression(pPVar25);
      pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar26);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_578,
                 &pEVar27->return_type);
      pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar26);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_628,
                 &pEVar27->return_type);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_648,puVar26);
      sVar51 = sVar51 + 1;
    } while (sVar51 < (ulong)((long)(pFVar17->children).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pFVar17->children).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  FunctionBinder::FunctionBinder((FunctionBinder *)local_3f0,(this->super_ExpressionBinder).binder);
  this_04 = &local_588->functions;
  local_580 = FunctionBinder::BindFunction
                        ((FunctionBinder *)local_3f0,
                         &(local_588->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                          super_CatalogEntry.name,this_04,
                         (vector<duckdb::LogicalType,_true> *)&local_578,(ErrorData *)local_608);
  if (local_580.index == 0xffffffffffffffff) {
    ErrorData::AddQueryLocation((ErrorData *)local_608,&pFVar17->super_ParsedExpression);
    local_530 = (undefined1  [8])((long)local_528 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_530,anon_var_dwarf_4ed193b + 9);
    ErrorData::Throw((ErrorData *)local_608,(string *)local_530);
  }
  offset = optional_idx::GetIndex(&local_580);
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            ((AggregateFunction *)local_530,&this_04->super_FunctionSet<duckdb::AggregateFunction>,
             offset);
  local_6e8.context = (ClientContext *)0x0;
  pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
            operator->(this_01);
  if ((pOVar22->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pOVar22->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar35 = (ClientContext *)operator_new(0x28);
    BoundOrderModifier::BoundOrderModifier((BoundOrderModifier *)pCVar35);
    if (local_6e8.context != (ClientContext *)0x0) {
      pBVar15 = (BoundResultModifier *)
                &(local_6e8.context)->super_enable_shared_from_this<duckdb::ClientContext>;
      local_6e8.context = pCVar35;
      (*pBVar15->_vptr_BoundResultModifier[1])();
      pCVar35 = local_6e8.context;
    }
    local_6e8.context = pCVar35;
    pDVar36 = DBConfig::GetConfig((this->super_ExpressionBinder).context);
    pOVar22 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->(this_01);
    pOVar5 = (pOVar22->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar45 = (pOVar22->orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_start; pOVar45 != pOVar5;
        pOVar45 = pOVar45 + 1) {
      pPVar25 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(&pOVar45->expression);
      puVar26 = BoundExpression::GetExpression(pPVar25);
      pCVar35 = (this->super_ExpressionBinder).context;
      pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar26);
      this_03 = CollationBinding::Get(pCVar35);
      CollationBinding::PushCollation(this_03,pCVar35,puVar26,&pEVar27->return_type,ALL_COLLATIONS);
      order_type = DBConfig::ResolveOrder(pDVar36,pOVar45->type);
      local_6b8[0] = (ExportAggregateFunction)order_type;
      OVar19 = DBConfig::ResolveNullOrder(pDVar36,order_type,pOVar45->null_order);
      local_400.table_index = CONCAT71(local_400.table_index._1_7_,OVar19);
      pBVar37 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                              *)&local_6e8.context);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar37->orders,local_6b8,(OrderByNullType *)&local_400,puVar26);
    }
  }
  if ((local_6d0->distinct == true) && (local_6e8.context != (ClientContext *)0x0)) {
    pBVar37 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
              ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                            *)&local_6e8.context);
    pBVar52 = (pBVar37->orders).
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar8 = (pBVar37->orders).
             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar52 != pBVar8) {
      bVar46 = 1;
      do {
        bVar18 = IsFunctionallyDependent
                           (&pBVar52->expression,
                            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)&local_648);
        bVar46 = bVar46 & bVar18;
        pBVar52 = pBVar52 + 1;
      } while (pBVar52 != pBVar8);
      if (bVar46 == 0) {
        pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
        local_6b8._0_8_ = local_6b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6b8,
                   "In a DISTINCT aggregate, ORDER BY expressions must appear in the argument list",
                   "");
        BinderException::BinderException(pBVar42,(string *)local_6b8);
        __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  SimpleFunction::SimpleFunction(&local_160.super_SimpleFunction,(SimpleFunction *)local_530);
  local_160.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_0243ff60;
  LogicalType::LogicalType(&local_160.return_type,&LStack_4a0);
  pFVar17 = local_6d0;
  local_160.stability = local_488;
  local_160.null_handling = FStack_487;
  local_160.errors = FStack_486;
  local_160.collation_handling = FStack_485;
  local_160.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02433f70;
  puVar47 = auStack_480;
  puVar48 = auStack_b0;
  for (lVar44 = 0xd; lVar44 != 0; lVar44 = lVar44 + -1) {
    *puVar48 = *puVar47;
    puVar47 = puVar47 + (ulong)bVar53 * -2 + 1;
    puVar48 = puVar48 + (ulong)bVar53 * -2 + 1;
  }
  auStack_b0[0xd]._0_1_ = (AggregateOrderDependent)auStack_480[0xd];
  auStack_b0[0xd]._1_1_ = auStack_480[0xd]._1_1_;
  local_40 = local_410;
  local_38 = local_408._M_pi;
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_408._M_pi)->_M_use_count = (local_408._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_408._M_pi)->_M_use_count = (local_408._M_pi)->_M_use_count + 1;
    }
  }
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_648.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_648.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_648.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_648.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_648.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_648.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_650 = local_6f8;
  FunctionBinder::BindAggregateFunction
            (&local_6e8,(AggregateFunction *)local_3f0,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_160,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_278,(AggregateType)&local_650);
  if (local_650 != (type)0x0) {
    (*(local_650->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  local_650 = (type)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_278);
  local_160.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02433f70;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_160);
  if (pFVar17->export_state == true) {
    local_658._M_head_impl = (BoundAggregateExpression *)local_6e8.binder.ptr;
    local_6e8.binder.ptr = (Binder *)0x0;
    ExportAggregateFunction::Bind
              ((ExportAggregateFunction *)local_6b8,
               (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                *)&local_658);
    uVar21 = local_6b8._0_8_;
    oVar16.ptr = local_6e8.binder.ptr;
    local_6b8._0_8_ = (Expression *)0x0;
    local_6e8.binder.ptr = (Binder *)uVar21;
    if ((oVar16.ptr != (Binder *)0x0) &&
       ((*(code *)((((oVar16.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)(),
       (Expression *)local_6b8._0_8_ != (Expression *)0x0)) {
      (*((BaseExpression *)local_6b8._0_8_)->_vptr_BaseExpression[1])();
    }
    local_6b8._0_8_ = (type)0x0;
    if ((Binder *)local_658._M_head_impl != (Binder *)0x0) {
      (*((local_658._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    local_658._M_head_impl = (BoundAggregateExpression *)0x0;
  }
  pBVar38 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                          *)&local_6e8);
  pCVar35 = local_6e8.context;
  local_6e8.context = (ClientContext *)0x0;
  _Var9._M_head_impl =
       (pBVar38->order_bys).
       super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
       .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
  (pBVar38->order_bys).
  super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
  .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
       (BoundOrderModifier *)pCVar35;
  if (_Var9._M_head_impl != (BoundOrderModifier *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BoundResultModifier + 8))();
  }
  pBVar10 = this->node;
  local_6b8._0_8_ =
       unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
       ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                    *)&local_6e8);
  iVar39 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(pBVar10->aggregate_map)._M_h,(key_type *)local_6b8);
  if (iVar39.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    pBVar10 = this->node;
    puVar11 = (pBVar10->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar12 = (pBVar10->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_6b8._0_8_ =
         unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
         ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                      *)&local_6e8);
    pmVar40 = ::std::__detail::
              _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pBVar10->aggregate_map,(key_type *)local_6b8);
    local_6b8._0_8_ = local_6e8.binder.ptr;
    __n = (long)puVar11 - (long)puVar12 >> 3;
    *pmVar40 = __n;
    local_6e8.binder.ptr = (Binder *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&this->node->aggregates,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_6b8);
    if ((type)local_6b8._0_8_ != (type)0x0) {
      (*(((Expression *)local_6b8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  else {
    __n = *(size_type *)
           ((long)iVar39.
                  super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
                  ._M_cur + 0x10);
  }
  sVar13 = (pFVar17->super_ParsedExpression).super_BaseExpression.alias._M_string_length;
  if (sVar13 == 0) {
    pvVar41 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](&this->node->aggregates,__n);
    pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar41);
    (*(pEVar27->super_BaseExpression)._vptr_BaseExpression[8])(local_6b8,pEVar27);
  }
  else {
    local_6b8._0_8_ = local_6b8 + 0x10;
    pcVar14 = (pFVar17->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_6b8,pcVar14,pcVar14 + sVar13);
  }
  pvVar41 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&this->node->aggregates,__n);
  pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar41);
  local_400.table_index = this->node->aggregate_index;
  local_400.column_index = __n;
  make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
            ((duckdb *)&local_660,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8,
             &pEVar27->return_type,&local_400,&local_610);
  if ((type)local_6b8._0_8_ != (type)(local_6b8 + 0x10)) {
    operator_delete((void *)local_6b8._0_8_);
  }
  local_668 = local_660.super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  local_660.super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)(BaseStatistics *)0x0;
  BindResult::BindResult
            (local_678,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_668);
  if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
      local_668._M_head_impl != (BaseStatistics *)0x0) {
    (**(code **)(*(long *)&(local_668._M_head_impl)->type + 8))();
  }
  local_668._M_head_impl = (BaseStatistics *)0x0;
  if (local_660.super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
      (BaseStatistics *)0x0) {
    (**(code **)(*(long *)local_660.super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>.
                          _M_head_impl + 8))();
  }
  if (local_6e8.binder.ptr != (Binder *)0x0) {
    (*(((Expression *)&(local_6e8.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->
      super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_6e8.context != (ClientContext *)0x0) {
    (*(code *)((((local_6e8.context)->super_enable_shared_from_this<duckdb::ClientContext>).
                __weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  local_530 = (undefined1  [8])&PTR__AggregateFunction_02433f70;
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_530);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_648);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_628);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_578);
LAB_00d71dc1:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_5c0);
  if (local_5e0._M_p != local_608 + 0x38) {
    operator_delete(local_5e0._M_p);
  }
  if ((undefined1 *)local_608._8_8_ != local_608 + 0x18) {
    operator_delete((void *)local_608._8_8_);
  }
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_2e0);
  return local_678;
}

Assistant:

BindResult BaseSelectBinder::BindAggregate(FunctionExpression &aggr, AggregateFunctionCatalogEntry &func, idx_t depth) {
	// first bind the child of the aggregate expression (if any)
	this->bound_aggregate = true;
	unique_ptr<Expression> bound_filter;
	AggregateBinder aggregate_binder(binder, context);
	ErrorData error;

	// Now we bind the filter (if any)
	if (aggr.filter) {
		aggregate_binder.BindChild(aggr.filter, 0, error);
	}

	// Handle ordered-set aggregates by moving the single ORDER BY expression to the front of the children.
	//	https://www.postgresql.org/docs/current/functions-aggregate.html#FUNCTIONS-ORDEREDSET-TABLE
	// We also have to handle ORDER BY in the argument list, so note how many arguments we should have
	// and only inject the ordering expression if there are too few.
	idx_t ordered_set_agg = 0;
	bool negate_fractions = false;
	if (aggr.order_bys && aggr.order_bys->orders.size() == 1) {
		const auto &func_name = aggr.function_name;
		if (func_name == "mode") {
			ordered_set_agg = 1;
		} else if (func_name == "quantile_cont" || func_name == "quantile_disc") {
			ordered_set_agg = 2;

			auto &config = DBConfig::GetConfig(context);
			const auto &order = aggr.order_bys->orders[0];
			const auto sense =
			    (order.type == OrderType::ORDER_DEFAULT) ? config.options.default_order_type : order.type;
			negate_fractions = (sense == OrderType::DESCENDING);
		}
	}

	for (idx_t i = 0; i < aggr.children.size(); ++i) {
		auto &child = aggr.children[i];
		aggregate_binder.BindChild(child, 0, error);
		// We have to negate the fractions for PERCENTILE_XXXX DESC
		if (!error.HasError() && ordered_set_agg && i == aggr.children.size() - 1) {
			NegatePercentileFractions(context, child, negate_fractions);
		}
	}

	// Bind the ORDER BYs, if any
	if (aggr.order_bys && !aggr.order_bys->orders.empty()) {
		for (auto &order : aggr.order_bys->orders) {
			if (order.expression->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
				auto &const_expr = order.expression->Cast<ConstantExpression>();
				if (!const_expr.value.type().IsIntegral()) {
					auto &config = ClientConfig::GetConfig(context);
					if (!config.order_by_non_integer_literal) {
						throw BinderException(
						    *order.expression,
						    "ORDER BY non-integer literal has no effect.\n* SET order_by_non_integer_literal=true to "
						    "allow this behavior.\n\nPerhaps you misplaced ORDER BY; ORDER BY must appear "
						    "after all regular arguments of the aggregate.");
					}
				}
			}
			aggregate_binder.BindChild(order.expression, 0, error);
		}
	}

	if (error.HasError()) {
		// failed to bind child
		if (aggregate_binder.HasBoundColumns()) {
			for (idx_t i = 0; i < aggr.children.size(); i++) {
				// however, we bound columns!
				// that means this aggregation belongs to this node
				// check if we have to resolve any errors by binding with parent binders
				auto result = aggregate_binder.BindCorrelatedColumns(aggr.children[i], error);
				// if there is still an error after this, we could not successfully bind the aggregate
				if (result.HasError()) {
					result.error.Throw();
				}
				auto &bound_expr = BoundExpression::GetExpression(*aggr.children[i]);
				ExtractCorrelatedExpressions(binder, *bound_expr);
			}
			if (aggr.filter) {
				auto result = aggregate_binder.BindCorrelatedColumns(aggr.filter, error);
				// if there is still an error after this, we could not successfully bind the aggregate
				if (result.HasError()) {
					result.error.Throw();
				}
				auto &bound_expr = BoundExpression::GetExpression(*aggr.filter);
				ExtractCorrelatedExpressions(binder, *bound_expr);
			}
			if (aggr.order_bys && !aggr.order_bys->orders.empty()) {
				for (auto &order : aggr.order_bys->orders) {
					auto result = aggregate_binder.BindCorrelatedColumns(order.expression, error);
					if (result.HasError()) {
						result.error.Throw();
					}
					auto &bound_expr = BoundExpression::GetExpression(*order.expression);
					ExtractCorrelatedExpressions(binder, *bound_expr);
				}
			}
		} else {
			// we didn't bind columns, try again in children
			return BindResult(std::move(error));
		}
	} else if (depth > 0 && !aggregate_binder.HasBoundColumns()) {
		return BindResult("Aggregate with only constant parameters has to be bound in the root subquery");
	}

	if (aggr.filter) {
		auto &child = BoundExpression::GetExpression(*aggr.filter);
		bound_filter = BoundCastExpression::AddCastToType(context, std::move(child), LogicalType::BOOLEAN);
	}

	// all children bound successfully
	// extract the children and types
	vector<LogicalType> types;
	vector<LogicalType> arguments;
	vector<unique_ptr<Expression>> children;

	if (ordered_set_agg) {
		const bool order_sensitive = (aggr.function_name == "mode");
		// Inject missing ordering arguments
		if (aggr.children.size() < ordered_set_agg) {
			for (auto &order : aggr.order_bys->orders) {
				auto &child = BoundExpression::GetExpression(*order.expression);
				types.push_back(child->return_type);
				arguments.push_back(child->return_type);
				if (order_sensitive) {
					children.push_back(child->Copy());
				} else {
					children.push_back(std::move(child));
				}
			}
		}
		if (!order_sensitive) {
			aggr.order_bys->orders.clear();
		}
	}

	for (idx_t i = 0; i < aggr.children.size(); i++) {
		auto &child = BoundExpression::GetExpression(*aggr.children[i]);
		types.push_back(child->return_type);
		arguments.push_back(child->return_type);
		children.push_back(std::move(child));
	}

	// bind the aggregate
	FunctionBinder function_binder(binder);
	auto best_function = function_binder.BindFunction(func.name, func.functions, types, error);
	if (!best_function.IsValid()) {
		error.AddQueryLocation(aggr);
		error.Throw();
	}
	// found a matching function!
	auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());

	// Bind any sort columns, unless the aggregate is order-insensitive
	unique_ptr<BoundOrderModifier> order_bys;
	if (!aggr.order_bys->orders.empty()) {
		order_bys = make_uniq<BoundOrderModifier>();
		auto &config = DBConfig::GetConfig(context);
		for (auto &order : aggr.order_bys->orders) {
			auto &order_expr = BoundExpression::GetExpression(*order.expression);
			PushCollation(context, order_expr, order_expr->return_type);
			const auto sense = config.ResolveOrder(order.type);
			const auto null_order = config.ResolveNullOrder(sense, order.null_order);
			order_bys->orders.emplace_back(sense, null_order, std::move(order_expr));
		}
	}

	// If the aggregate is DISTINCT then the ORDER BYs need to be functional dependencies of the arguments.
	if (aggr.distinct && order_bys) {
		bool in_args = true;
		for (const auto &order_by : order_bys->orders) {
			in_args &= IsFunctionallyDependent(order_by.expression, children);
		}

		if (!in_args) {
			throw BinderException("In a DISTINCT aggregate, ORDER BY expressions must appear in the argument list");
		}
	}

	auto aggregate =
	    function_binder.BindAggregateFunction(bound_function, std::move(children), std::move(bound_filter),
	                                          aggr.distinct ? AggregateType::DISTINCT : AggregateType::NON_DISTINCT);
	if (aggr.export_state) {
		aggregate = ExportAggregateFunction::Bind(std::move(aggregate));
	}
	aggregate->order_bys = std::move(order_bys);

	// check for all the aggregates if this aggregate already exists
	idx_t aggr_index;
	auto entry = node.aggregate_map.find(*aggregate);
	if (entry == node.aggregate_map.end()) {
		// new aggregate: insert into aggregate list
		aggr_index = node.aggregates.size();
		node.aggregate_map[*aggregate] = aggr_index;
		node.aggregates.push_back(std::move(aggregate));
	} else {
		// duplicate aggregate: simplify refer to this aggregate
		aggr_index = entry->second;
	}

	// now create a column reference referring to the aggregate
	auto colref = make_uniq<BoundColumnRefExpression>(
	    aggr.GetAlias().empty() ? node.aggregates[aggr_index]->ToString() : aggr.GetAlias(),
	    node.aggregates[aggr_index]->return_type, ColumnBinding(node.aggregate_index, aggr_index), depth);
	// move the aggregate expression into the set of bound aggregates
	return BindResult(std::move(colref));
}